

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationTests.cpp
# Opt level: O0

void vkt::tessellation::anon_unknown_1::createChildren(TestCaseGroup *tessellationTests)

{
  TestContext *testCtx_00;
  TestNode *pTVar1;
  TestContext *testCtx;
  TestCaseGroup *tessellationTests_local;
  
  testCtx_00 = tcu::TestNode::getTestContext(&tessellationTests->super_TestNode);
  pTVar1 = &createLimitsTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createCoordinatesTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createWindingTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createShaderInputOutputTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createMiscDrawTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createCommonEdgeTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createFractionalSpacingTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createPrimitiveDiscardTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createInvarianceTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createUserDefinedIOTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createGeometryInteractionTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  return;
}

Assistant:

void createChildren (tcu::TestCaseGroup* tessellationTests)
{
	tcu::TestContext& testCtx = tessellationTests->getTestContext();

	tessellationTests->addChild(createLimitsTests				(testCtx));
	tessellationTests->addChild(createCoordinatesTests			(testCtx));
	tessellationTests->addChild(createWindingTests				(testCtx));
	tessellationTests->addChild(createShaderInputOutputTests	(testCtx));
	tessellationTests->addChild(createMiscDrawTests				(testCtx));
	tessellationTests->addChild(createCommonEdgeTests			(testCtx));
	tessellationTests->addChild(createFractionalSpacingTests	(testCtx));
	tessellationTests->addChild(createPrimitiveDiscardTests		(testCtx));
	tessellationTests->addChild(createInvarianceTests			(testCtx));
	tessellationTests->addChild(createUserDefinedIOTests		(testCtx));
	tessellationTests->addChild(createGeometryInteractionTests	(testCtx));
}